

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->NavWindow;
  if ((((pIVar1 == window) && (GImGui->NavMoveRequest == true)) &&
      ((GImGui->NavMoveResultLocal).ID == 0)) &&
     ((((GImGui->NavMoveResultOther).ID == 0 &&
       (GImGui->NavMoveRequestForward == ImGuiNavForward_None)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    fVar10 = window->NavRectRel[0].Min.y;
    fVar7 = window->NavRectRel[0].Max.y;
    uVar5 = GImGui->NavMoveDir;
    if (uVar5 == 0) {
      if ((move_flags & 5U) == 0) {
        return;
      }
      fVar8 = (window->SizeFull).x;
      fVar9 = (window->SizeContents).x;
      uVar5 = -(uint)(fVar9 <= fVar8);
      if ((move_flags & 4U) != 0) {
        fVar11 = fVar7 - fVar10;
        fVar10 = fVar10 - fVar11;
        fVar7 = fVar7 - fVar11;
      }
      fVar9 = (float)(~uVar5 & (uint)fVar9 | (uint)fVar8 & uVar5) - (window->Scroll).x;
      uVar3 = (move_flags & 4U) >> 1;
      fVar8 = fVar9;
    }
    else if ((move_flags & 5U) == 0 || uVar5 != 1) {
      fVar8 = window->NavRectRel[0].Min.x;
      fVar9 = window->NavRectRel[0].Max.x;
      if ((move_flags & 10U) == 0 || uVar5 != 2) {
        if (uVar5 != 3 || (move_flags & 10U) == 0) {
          return;
        }
        fVar7 = -(window->Scroll).y;
        bVar4 = (move_flags & 8U) == 0;
        if (!bVar4) {
          fVar10 = fVar9 - fVar8;
          fVar8 = fVar8 + fVar10;
          fVar9 = fVar9 + fVar10;
        }
        uVar3 = 1;
      }
      else {
        fVar10 = (window->SizeFull).y;
        fVar7 = (window->SizeContents).y;
        uVar6 = -(uint)(fVar7 <= fVar10);
        uVar3 = 0;
        bVar4 = (move_flags & 8U) == 0;
        if (!bVar4) {
          fVar11 = fVar9 - fVar8;
          fVar8 = fVar8 - fVar11;
          fVar9 = fVar9 - fVar11;
        }
        fVar7 = (float)(~uVar6 & (uint)fVar7 | (uint)fVar10 & uVar6) - (window->Scroll).y;
      }
      fVar10 = fVar7;
      if (bVar4) {
        uVar3 = uVar5;
      }
    }
    else {
      fVar9 = -(window->Scroll).x;
      if ((move_flags & 4U) != 0) {
        fVar8 = fVar7 - fVar10;
        fVar10 = fVar10 + fVar8;
        fVar7 = fVar7 + fVar8;
      }
      uVar3 = ((move_flags & 4U) >> 1) + 1;
      fVar8 = fVar9;
    }
    GImGui->NavMoveRequest = false;
    pIVar2->NavAnyRequest = pIVar2->NavInitRequest;
    pIVar2->NavMoveClipDir = uVar3;
    pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    pIVar2->NavMoveRequestFlags = move_flags;
    pIVar1->NavRectRel[0].Min.x = fVar8;
    pIVar1->NavRectRel[0].Min.y = fVar10;
    pIVar1->NavRectRel[0].Max.x = fVar9;
    pIVar1->NavRectRel[0].Max.y = fVar7;
    return;
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->SizeContents.x) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->SizeContents.y) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}